

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::Cord::InlineRep::PrependTreeToTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  CordzUpdateScope CVar1;
  Nonnull<CordRepBtree_*> tree_00;
  CordRepBtree *pCVar2;
  CordzUpdateScope scope;
  CordzUpdateScope local_20;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0xf8,
                  "void absl::Cord::InlineRep::PrependTreeToTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  local_20.info_ = cord_internal::InlineData::cordz_info(&this->data_);
  if (local_20.info_ != (CordzInfo *)0x0) {
    cord_internal::CordzInfo::Lock(local_20.info_,method);
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x274,"CordRep *absl::cord_internal::InlineData::as_tree() const");
  }
  tree_00 = ForceBtree((this->data_).rep_.field_0.as_tree.rep);
  if (tree == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  if ((tree->tag < 5) && ((tree->tag != 1 || (*(byte *)(*(long *)&tree[1].refcount + 0xc) < 5)))) {
    pCVar2 = cord_internal::CordRepBtree::PrependSlow(tree_00,tree);
  }
  else {
    pCVar2 = cord_internal::CordRepBtree::
             AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>(tree_00,tree);
  }
  CVar1.info_ = local_20.info_;
  if (pCVar2 != (CordRepBtree *)0x0) {
    if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
      (this->data_).rep_.field_0.as_tree.rep = &pCVar2->super_CordRep;
      if (local_20.info_ != (CordzInfo *)0x0) {
        Mutex::AssertHeld(&(local_20.info_)->mutex_);
        (CVar1.info_)->rep_ = &pCVar2->super_CordRep;
      }
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_20);
      return;
    }
    __assert_fail("data_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x4f7,
                  "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x4f6,
                "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
               );
}

Assistant:

void Cord::InlineRep::PrependTreeToTree(absl::Nonnull<CordRep*> tree,
                                        MethodIdentifier method) {
  assert(is_tree());
  const CordzUpdateScope scope(data_.cordz_info(), method);
  tree = CordRepBtree::Prepend(ForceBtree(data_.as_tree()), tree);
  SetTree(tree, scope);
}